

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

void cmXMLParserEndElement(void *parser,char *name)

{
  allocator local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string((string *)local_30,name,&local_31);
  (**(code **)(*parser + 0x48))(parser,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void cmXMLParserEndElement(void* parser, const char* name)
{
  // End element handler that is registered with the XML_Parser.  This
  // just casts the user data to a cmXMLParser and calls EndElement.
  static_cast<cmXMLParser*>(parser)->EndElement(name);
}